

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen2_2x3.cpp
# Opt level: O2

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcVector>
                 (DB *db,LIST *params,IfcVector *in)

{
  size_t sVar1;
  TypeError *this;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg;
  string local_70;
  allocator<char> local_50 [32];
  
  sVar1 = GenericFill<Assimp::IFC::Schema_2x3::IfcGeometricRepresentationItem>
                    (db,params,&in->super_IfcGeometricRepresentationItem);
  if (0x10 < (ulong)((long)(params->members).
                           super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(params->members).
                          super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    EXPRESS::LIST::operator[]((LIST *)&arg,(size_t)params);
    GenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>>
              ((Lazy<Assimp::IFC::Schema_2x3::IfcDirection> *)
               &(in->super_IfcGeometricRepresentationItem).field_0x30,&arg,db);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&arg.
                super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    EXPRESS::LIST::operator[]((LIST *)&arg,(size_t)params);
    GenericConvert<double>(&in->Magnitude,&arg,db);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&arg.
                super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    return sVar1 + 2;
  }
  this = (TypeError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"expected 2 arguments to IfcVector",local_50);
  TypeError::TypeError(this,&local_70,0xffffffffffffffff,0xffffffffffffffff);
  __cxa_throw(this,&TypeError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t GenericFill<IfcVector>(const DB& db, const LIST& params, IfcVector* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcGeometricRepresentationItem*>(in));
	if (params.GetSize() < 2) { throw STEP::TypeError("expected 2 arguments to IfcVector"); }    do { // convert the 'Orientation' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->Orientation, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 0 to IfcVector to be a `IfcDirection`")); }
    } while(0);
    do { // convert the 'Magnitude' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->Magnitude, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 1 to IfcVector to be a `IfcLengthMeasure`")); }
    } while(0);
	return base;
}